

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O2

void __thiscall jsonChildren::clear(jsonChildren *this)

{
  json_index_t jVar1;
  bool condition;
  allocator local_39;
  json_string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Children is null clear",&local_39);
  JSONDebug::_JSON_ASSERT(true,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->array == (JSONNode **)0x0) {
    condition = this->mysize == 0;
  }
  else {
    jVar1 = this->mycapacity;
    std::__cxx11::string::string
              ((string *)&local_38,"mycapacity is not zero, but array is null",&local_39);
    JSONDebug::_JSON_ASSERT(jVar1 != 0,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    deleteAll(this);
    this->mysize = 0;
    condition = true;
  }
  std::__cxx11::string::string((string *)&local_38,"mysize is not zero after clear",&local_39);
  JSONDebug::_JSON_ASSERT(condition,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void clear() json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null clear"));
	   if (json_likely(array != 0)){  //don't bother clearing anything if there is nothing in it
		  JSON_ASSERT(mycapacity != 0, JSON_TEXT("mycapacity is not zero, but array is null"));
		  deleteAll();
		  mysize = 0;
	   }
	   JSON_ASSERT(mysize == 0, JSON_TEXT("mysize is not zero after clear"));
    }